

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testSerializeNewOrderSingle(int count)

{
  long lVar1;
  string local_410 [36];
  int local_3ec;
  long lStack_3e8;
  int i;
  long start;
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_178;
  undefined1 local_158 [8];
  Symbol symbol;
  undefined1 local_f8 [8];
  HandlInst handlInst;
  allocator<char> local_89;
  STRING local_88;
  undefined1 local_68 [8];
  ClOrdID clOrdID;
  int count_local;
  
  clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"ORDERID",&local_89);
  FIX::ClOrdID::ClOrdID((ClOrdID *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  symbol.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ = 0x31;
  FIX::HandlInst::HandlInst
            ((HandlInst *)local_f8,
             (CHAR *)((long)&symbol.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"LNUX",
             (allocator<char> *)
             ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
  FIX::Symbol::Symbol((Symbol *)local_158,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
  FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
                  "11FIX.4.2");
  FIX::TransactTime::now();
  FIX::OrdType::OrdType((OrdType *)&message.super_Message.field_0x150,"1FIX.4.2");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)&start,(ClOrdID *)local_68,(HandlInst *)local_f8,(Symbol *)local_158,
             (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
             (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics,
             (OrdType *)&message.super_Message.field_0x150);
  clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum =
       clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum + -1;
  lStack_3e8 = GetTickCount();
  for (local_3ec = 0; local_3ec <= clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum;
      local_3ec = local_3ec + 1) {
    FIX::Message::toString_abi_cxx11_((int)local_410,(int)&start,8);
    std::__cxx11::string::~string(local_410);
  }
  lVar1 = GetTickCount();
  lVar1 = lVar1 - lStack_3e8;
  FIX42::NewOrderSingle::~NewOrderSingle((NewOrderSingle *)&start);
  FIX::OrdType::~OrdType((OrdType *)&message.super_Message.field_0x150);
  FIX::TransactTime::~TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics);
  FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics);
  FIX::Symbol::~Symbol((Symbol *)local_158);
  FIX::HandlInst::~HandlInst((HandlInst *)local_f8);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)local_68);
  return lVar1;
}

Assistant:

long testSerializeNewOrderSingle(int count) {
  FIX::ClOrdID clOrdID("ORDERID");
  FIX::HandlInst handlInst('1');
  FIX::Symbol symbol("LNUX");
  FIX::Side side(FIX::Side_BUY);
  FIX::TransactTime transactTime = FIX::TransactTime::now();
  FIX::OrdType ordType(FIX::OrdType_MARKET);
  FIX42::NewOrderSingle message(clOrdID, handlInst, symbol, side, transactTime, ordType);

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.toString();
  }
  return GetTickCount() - start;
}